

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPAddressTest.cpp
# Opt level: O1

void __thiscall
jaegertracing::net::IPAddress_testResolveAddress_Test::TestBody
          (IPAddress_testResolveAddress_Test *this)

{
  char cVar1;
  AssertHelper aAStack_b8 [8];
  long *local_b0 [2];
  long local_a0 [2];
  unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter> local_90;
  unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter> local_68;
  unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter> local_40;
  
  cVar1 = testing::internal::AlwaysTrue();
  if (cVar1 == '\0') {
    testing::Message::Message((Message *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              (aAStack_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/IPAddressTest.cpp"
               ,0x2b,
               "Expected: resolveAddress(\"localhost\", 80, 2, SOCK_STREAM) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(aAStack_b8,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper(aAStack_b8);
    if (local_b0[0] == (long *)0x0) {
      return;
    }
    cVar1 = testing::internal::IsTrue(true);
  }
  else {
    cVar1 = testing::internal::AlwaysTrue();
    if (cVar1 != '\0') {
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"localhost","");
      jaegertracing::net::resolveAddress((string *)&local_40,(int)local_b0,0x50,2);
      std::unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter>::~unique_ptr(&local_40);
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0]);
      }
    }
    cVar1 = testing::internal::AlwaysTrue();
    if (cVar1 == '\0') {
      testing::Message::Message((Message *)local_b0);
      testing::internal::AssertHelper::AssertHelper
                (aAStack_b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/IPAddressTest.cpp"
                 ,0x30,
                 "Expected: resolveAddress(\"123456\", 80, 2, SOCK_STREAM) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=(aAStack_b8,(Message *)local_b0);
      testing::internal::AssertHelper::~AssertHelper(aAStack_b8);
      if (local_b0[0] == (long *)0x0) {
        return;
      }
      cVar1 = testing::internal::IsTrue(true);
    }
    else {
      cVar1 = testing::internal::AlwaysTrue();
      if (cVar1 != '\0') {
        local_b0[0] = local_a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"123456","");
        jaegertracing::net::resolveAddress((string *)&local_68,(int)local_b0,0x50,2);
        std::unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter>::~unique_ptr(&local_68);
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0]);
        }
      }
      cVar1 = testing::internal::AlwaysTrue();
      if (cVar1 != '\0') {
        local_b0[0] = local_a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"localhost","");
        jaegertracing::net::resolveAddress((string *)&local_90,(int)local_b0,0x50,-1);
        std::unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter>::~unique_ptr(&local_90);
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0]);
        }
      }
      testing::Message::Message((Message *)local_b0);
      testing::internal::AssertHelper::AssertHelper
                (aAStack_b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/IPAddressTest.cpp"
                 ,0x32,
                 "Expected: resolveAddress(\"localhost\", 80, -1) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
                );
      testing::internal::AssertHelper::operator=(aAStack_b8,(Message *)local_b0);
      testing::internal::AssertHelper::~AssertHelper(aAStack_b8);
      if (local_b0[0] == (long *)0x0) {
        return;
      }
      cVar1 = testing::internal::IsTrue(true);
    }
  }
  if ((cVar1 != '\0') && (local_b0[0] != (long *)0x0)) {
    (**(code **)(*local_b0[0] + 8))();
  }
  return;
}

Assistant:

TEST(IPAddress, testResolveAddress)
{
    ASSERT_NO_THROW(resolveAddress("localhost", 80, AF_INET, SOCK_STREAM));
#ifdef WIN32
    ASSERT_THROW(resolveAddress("123456", 80, AF_INET, SOCK_STREAM),
                 std::runtime_error);
#else
    ASSERT_NO_THROW(resolveAddress("123456", 80, AF_INET, SOCK_STREAM));
#endif
    ASSERT_THROW(resolveAddress("localhost", 80, -1), std::runtime_error);
}